

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 addFloat128Sigs(float128 a,float128 b,flag zSign,float_status *status)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t zSig0;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  float128 fVar18;
  
  uVar11 = a.low;
  uVar6 = b.low;
  uVar7 = a.high & 0xffffffffffff;
  uVar10 = a.high._6_2_ & 0x7fff;
  uVar9 = b.high & 0xffffffffffff;
  uVar16 = b.high._6_2_ & 0x7fff;
  iVar12 = uVar10 - uVar16;
  if (iVar12 == 0 || uVar10 < uVar16) {
    if (iVar12 < 0) {
      if (uVar16 == 0x7fff) {
        if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
            uVar6 == 0) {
          uVar7 = (ulong)zSign << 0x3f | 0x7fff000000000000;
          goto LAB_00d053bb;
        }
        goto LAB_00d052c3;
      }
      bVar17 = ((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0
      ;
      if (!bVar17) {
        uVar7 = uVar7 | 0x1000000000000;
      }
      iVar14 = -(uint)bVar17;
      iVar15 = iVar14 - iVar12;
      uVar10 = uVar16;
      if (iVar15 == 0) {
        uVar13 = 0;
        uVar8 = uVar7;
        uVar7 = uVar11;
        goto LAB_00d05407;
      }
      bVar4 = -((char)iVar14 - (char)iVar12);
      bVar3 = bVar4 & 0x3f;
      bVar5 = (byte)iVar15;
      if (iVar15 < 0x40) {
        uVar8 = uVar7 >> (bVar5 & 0x3f);
        uVar7 = uVar11 >> (bVar5 & 0x3f) | uVar7 << bVar3;
        uVar13 = uVar11 << bVar3;
LAB_00d053ef:
        uVar11 = 0;
      }
      else {
        if (iVar15 == 0x40) {
          uVar8 = 0;
          uVar13 = uVar11;
          goto LAB_00d053ef;
        }
        if (iVar15 < 0x80) {
          uVar13 = uVar7 << (bVar4 & 0x3f);
          uVar7 = uVar7 >> (bVar5 & 0x3f);
          uVar8 = 0;
        }
        else {
          uVar13 = (ulong)(uVar7 != 0);
          if (iVar15 == 0x80) {
            uVar13 = uVar7;
          }
          uVar8 = 0;
          uVar7 = 0;
        }
      }
      uVar13 = uVar11 != 0 | uVar13;
      goto LAB_00d05407;
    }
    if (uVar10 == 0x7fff) {
      if (((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
           uVar11 == 0) && uVar6 == 0) &&
          ((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
        return a;
      }
LAB_00d052c3:
      fVar18 = propagateFloat128NaN(a,b,status);
      return fVar18;
    }
    uVar2 = uVar6 + uVar11;
    uVar7 = uVar9 + uVar7 + (ulong)CARRY8(uVar6,uVar11);
    if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      if (status->flush_to_zero == '\0') {
        fVar18.high = (ulong)zSign << 0x3f | uVar7;
        fVar18.low = uVar2;
        return fVar18;
      }
      if (uVar7 != 0 || uVar2 != 0) {
        status->float_exception_flags = status->float_exception_flags | 0x80;
      }
      uVar7 = (ulong)zSign << 0x3f;
LAB_00d053bb:
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar7;
      return (float128)(auVar1 << 0x40);
    }
    zSig0 = uVar7 | 0x2000000000000;
    uVar13 = 0;
  }
  else {
    if (uVar10 == 0x7fff) {
      if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
          uVar11 == 0) {
        return a;
      }
      goto LAB_00d052c3;
    }
    bVar17 = ((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0;
    if (!bVar17) {
      uVar9 = uVar9 | 0x1000000000000;
    }
    iVar12 = iVar12 - (uint)bVar17;
    uVar8 = uVar7;
    if (iVar12 == 0) {
      uVar13 = 0;
      uVar7 = uVar11;
      goto LAB_00d05407;
    }
    bVar4 = (byte)iVar12;
    bVar3 = -bVar4 & 0x3f;
    if (iVar12 < 0x40) {
      uVar7 = uVar9 >> (bVar4 & 0x3f);
      uVar9 = uVar6 >> (bVar4 & 0x3f) | uVar9 << bVar3;
      uVar13 = uVar6 << bVar3;
LAB_00d05303:
      uVar2 = 0;
      uVar6 = uVar9;
    }
    else {
      if (iVar12 == 0x40) {
        uVar7 = 0;
        uVar13 = uVar6;
        goto LAB_00d05303;
      }
      uVar2 = uVar6;
      if (iVar12 < 0x80) {
        uVar13 = uVar9 << (-bVar4 & 0x3f);
        uVar7 = 0;
        uVar6 = uVar9 >> (bVar4 & 0x3f);
      }
      else {
        uVar13 = (ulong)(uVar9 != 0);
        if (iVar12 == 0x80) {
          uVar13 = uVar9;
        }
        uVar7 = 0;
        uVar6 = 0;
      }
    }
    uVar13 = uVar2 != 0 | uVar13;
    uVar9 = uVar7;
    uVar7 = uVar11;
LAB_00d05407:
    uVar2 = uVar7 + uVar6;
    zSig0 = (uVar8 | 0x1000000000000) + uVar9 + (ulong)CARRY8(uVar7,uVar6);
    if (zSig0 >> 0x31 == 0) {
      uVar10 = uVar10 - 1;
      uVar7 = uVar2;
      goto LAB_00d05444;
    }
  }
  uVar7 = zSig0 << 0x3f | uVar2 >> 1;
  zSig0 = zSig0 >> 1;
  uVar13 = (ulong)(uVar13 != 0) | uVar2 << 0x3f;
LAB_00d05444:
  fVar18 = roundAndPackFloat128(zSign,uVar10,zSig0,uVar7,uVar13,status);
  return fVar18;
}

Assistant:

static float128 addFloat128Sigs(float128 a, float128 b, flag zSign,
                                float_status *status)
{
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2;
    int32_t expDiff;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    expDiff = aExp - bExp;
    if ( 0 < expDiff ) {
        if ( aExp == 0x7FFF ) {
            if (aSig0 | aSig1) {
                return propagateFloat128NaN(a, b, status);
            }
            return a;
        }
        if ( bExp == 0 ) {
            --expDiff;
        }
        else {
            bSig0 |= UINT64_C(0x0001000000000000);
        }
        shift128ExtraRightJamming(
            bSig0, bSig1, 0, expDiff, &bSig0, &bSig1, &zSig2 );
        zExp = aExp;
    }
    else if ( expDiff < 0 ) {
        if ( bExp == 0x7FFF ) {
            if (bSig0 | bSig1) {
                return propagateFloat128NaN(a, b, status);
            }
            return packFloat128( zSign, 0x7FFF, 0, 0 );
        }
        if ( aExp == 0 ) {
            ++expDiff;
        }
        else {
            aSig0 |= UINT64_C(0x0001000000000000);
        }
        shift128ExtraRightJamming(
            aSig0, aSig1, 0, - expDiff, &aSig0, &aSig1, &zSig2 );
        zExp = bExp;
    }
    else {
        if ( aExp == 0x7FFF ) {
            if ( aSig0 | aSig1 | bSig0 | bSig1 ) {
                return propagateFloat128NaN(a, b, status);
            }
            return a;
        }
        add128( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1 );
        if ( aExp == 0 ) {
            if (status->flush_to_zero) {
                if (zSig0 | zSig1) {
                    float_raise(float_flag_output_denormal, status);
                }
                return packFloat128(zSign, 0, 0, 0);
            }
            return packFloat128( zSign, 0, zSig0, zSig1 );
        }
        zSig2 = 0;
        zSig0 |= UINT64_C(0x0002000000000000);
        zExp = aExp;
        goto shiftRight1;
    }
    aSig0 |= UINT64_C(0x0001000000000000);
    add128( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1 );
    --zExp;
    if ( zSig0 < UINT64_C(0x0002000000000000) ) goto roundAndPack;
    ++zExp;
 shiftRight1:
    shift128ExtraRightJamming(
        zSig0, zSig1, zSig2, 1, &zSig0, &zSig1, &zSig2 );
 roundAndPack:
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}